

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbePmaReaderIncrInit(PmaReader *pReadr,int eMode)

{
  IncrMerger **ppIVar1;
  IncrMerger *pIVar2;
  SortSubtask *pSVar3;
  int iVar4;
  SQLiteThread *pSVar5;
  long lVar6;
  
  pIVar2 = pReadr->pIncr;
  iVar4 = 0;
  if (pIVar2 != (IncrMerger *)0x0) {
    if (pIVar2->bUseThread == 0) {
      iVar4 = vdbePmaReaderIncrMergeInit(pReadr,eMode);
      return iVar4;
    }
    pSVar3 = pIVar2->pTask;
    pSVar3->pThread = (SQLiteThread *)0x0;
    pSVar5 = (SQLiteThread *)sqlite3Malloc(0x18);
    if (pSVar5 == (SQLiteThread *)0x0) {
      iVar4 = 7;
    }
    else {
      if (((uint)((ulong)((long)(int)pSVar5 * 0x78787879) >> 0x23) - ((int)pSVar5 >> 0x1f) & 1) == 0
         ) {
        pSVar5->xTask = (_func_void_ptr_void_ptr *)0x0;
        iVar4 = vdbePmaReaderIncrMergeInit(pReadr,1);
        ppIVar1 = &pReadr->pIncr;
        pReadr = (PmaReader *)(long)iVar4;
        (*ppIVar1)->pTask->bDone = 1;
        lVar6 = 0x10;
      }
      else {
        pSVar5->xTask = vdbePmaReaderBgIncrInit;
        lVar6 = 8;
      }
      *(PmaReader **)((long)&pSVar5->xTask + lVar6) = pReadr;
      pSVar3->pThread = pSVar5;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int vdbePmaReaderIncrInit(PmaReader *pReadr, int eMode){
  IncrMerger *pIncr = pReadr->pIncr;   /* Incremental merger */
  int rc = SQLITE_OK;                  /* Return code */
  if( pIncr ){
#if SQLITE_MAX_WORKER_THREADS>0
    assert( pIncr->bUseThread==0 || eMode==INCRINIT_TASK );
    if( pIncr->bUseThread ){
      void *pCtx = (void*)pReadr;
      rc = vdbeSorterCreateThread(pIncr->pTask, vdbePmaReaderBgIncrInit, pCtx);
    }else
#endif
    {
      rc = vdbePmaReaderIncrMergeInit(pReadr, eMode);
    }
  }
  return rc;
}